

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

void __thiscall baryonyx::itm::shared_subvector::check_index(shared_subvector *this,size_type i)

{
  if ((ulong)((long)(this->m_container).
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->m_container).super__Vector_base<signed_char,_std::allocator<signed_char>_>
                   ._M_impl.super__Vector_impl_data._M_start) < (ulong)(this->m_element_size + i)) {
    details::fail_fast("Assertion","i + m_element_size <= m_container.size()",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"182");
  }
  if (i % this->m_element_size == 0) {
    return;
  }
  details::fail_fast("Assertion","i % m_element_size == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                     ,"183");
}

Assistant:

void check_index([[maybe_unused]] size_type i) const noexcept
    {
        bx_assert(i + m_element_size <= m_container.size());
        bx_assert(i % m_element_size == 0);
    }